

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInputPart.cpp
# Opt level: O0

void anon_unknown.dwarf_1ab374::setOutputFrameBuffer
               (FrameBuffer *frameBuffer,int pixelType,Array2D<unsigned_int> *uData,
               Array2D<float> *fData,Array2D<Imath_3_2::half> *hData,int width)

{
  uint *puVar1;
  float *pfVar2;
  half *phVar3;
  Array2D<float> *in_RCX;
  Array2D<unsigned_int> *in_RDX;
  int in_ESI;
  char *in_RDI;
  Array2D<Imath_3_2::half> *in_R8;
  int in_R9D;
  Slice local_d8 [56];
  Slice local_a0 [56];
  Slice local_68 [60];
  int local_2c;
  
  local_2c = in_R9D;
  if (in_ESI == 0) {
    puVar1 = Imf_3_2::Array2D<unsigned_int>::operator[](in_RDX,0);
    Imf_3_2::Slice::Slice(local_68,UINT,(char *)puVar1,4,(long)local_2c << 2,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert(in_RDI,(Slice *)"UINT");
  }
  else if (in_ESI == 1) {
    pfVar2 = Imf_3_2::Array2D<float>::operator[](in_RCX,0);
    Imf_3_2::Slice::Slice(local_a0,FLOAT,(char *)pfVar2,4,(long)local_2c << 2,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert(in_RDI,(Slice *)"FLOAT");
  }
  else if (in_ESI == 2) {
    phVar3 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](in_R8,0);
    Imf_3_2::Slice::Slice(local_d8,HALF,(char *)phVar3,2,(long)local_2c << 1,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert(in_RDI,(Slice *)"HALF");
  }
  return;
}

Assistant:

void
setOutputFrameBuffer (
    FrameBuffer&           frameBuffer,
    int                    pixelType,
    Array2D<unsigned int>& uData,
    Array2D<float>&        fData,
    Array2D<half>&         hData,
    int                    width)
{
    switch (pixelType)
    {
        case 0:
            frameBuffer.insert (
                "UINT",
                Slice (
                    IMF::UINT,
                    (char*) (&uData[0][0]),
                    sizeof (uData[0][0]) * 1,
                    sizeof (uData[0][0]) * width));
            break;
        case 1:
            frameBuffer.insert (
                "FLOAT",
                Slice (
                    IMF::FLOAT,
                    (char*) (&fData[0][0]),
                    sizeof (fData[0][0]) * 1,
                    sizeof (fData[0][0]) * width));
            break;
        case 2:
            frameBuffer.insert (
                "HALF",
                Slice (
                    IMF::HALF,
                    (char*) (&hData[0][0]),
                    sizeof (hData[0][0]) * 1,
                    sizeof (hData[0][0]) * width));
            break;
    }
}